

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int read_line(lua_State *L,FILE *f,int chop)

{
  bool bVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  luaL_Buffer b;
  luaL_Buffer local_2050;
  
  luaL_buffinit(L,&local_2050);
  uVar5 = (ulong)(uint)chop;
  do {
    __s = luaL_prepbuffsize(&local_2050,0x2000);
    pcVar2 = fgets(__s,0x2000,(FILE *)f);
    if (pcVar2 == (char *)0x0) {
      luaL_pushresult(&local_2050);
      sVar4 = lua_rawlen(L,-1);
      chop = (int)(sVar4 != 0);
LAB_00117a17:
      bVar1 = false;
    }
    else {
      sVar3 = strlen(__s);
      if ((sVar3 != 0) && (__s[sVar3 - 1] == '\n')) {
        local_2050.n = local_2050.n + (sVar3 - uVar5);
        luaL_pushresult(&local_2050);
        chop = 1;
        goto LAB_00117a17;
      }
      local_2050.n = local_2050.n + sVar3;
      bVar1 = true;
    }
    if (!bVar1) {
      return chop;
    }
  } while( true );
}

Assistant:

static int read_line (lua_State *L, FILE *f, int chop) {
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  for (;;) {
    size_t l;
    char *p = luaL_prepbuffer(&b);
    if (fgets(p, LUAL_BUFFERSIZE, f) == NULL) {  /* eof? */
      luaL_pushresult(&b);  /* close buffer */
      return (lua_rawlen(L, -1) > 0);  /* check whether read something */
    }
    l = strlen(p);
    if (l == 0 || p[l-1] != '\n')
      luaL_addsize(&b, l);
    else {
      luaL_addsize(&b, l - chop);  /* chop 'eol' if needed */
      luaL_pushresult(&b);  /* close buffer */
      return 1;  /* read at least an `eol' */
    }
  }
}